

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O0

void nni_epoll_thr(void *arg)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  uint mask;
  nni_posix_pfd *pfd;
  uint64_t clear;
  epoll_event *ev;
  byte local_31d;
  int i;
  undefined1 local_318 [3];
  _Bool reap;
  int n;
  epoll_event events [64];
  nni_posix_pollq *pq;
  void *arg_local;
  
  events[0x3f].data.ptr = arg;
  while( true ) {
    local_31d = 0;
    i = epoll_wait(*(int *)(events[0x3f].data.u64 + 0x60),(epoll_event *)local_318,0x40,-1);
    if ((i < 0) && (piVar2 = __errno_location(), *piVar2 == 9)) break;
    for (ev._4_4_ = 0; ev._4_4_ < i; ev._4_4_ = ev._4_4_ + 1) {
      lVar3 = (long)ev._4_4_;
      clear = (uint64_t)(local_318 + lVar3 * 0xc);
      if ((*(long *)((long)&events[lVar3 + -1].data + 4) == 0) && ((*(uint *)clear & 1) != 0)) {
        read(*(int *)(events[0x3f].data.u64 + 100),&pfd,8);
        local_31d = 1;
      }
      else {
        lVar3 = *(long *)((long)&events[lVar3 + -1].data + 4);
        uVar1 = *(uint *)clear;
        nni_atomic_and((nni_atomic_int *)(lVar3 + 0x30),uVar1 & 0x1d ^ 0xffffffff);
        (**(code **)(lVar3 + 0x20))(*(undefined8 *)(lVar3 + 0x28),uVar1 & 0x1d);
      }
    }
    if ((local_31d & 1) != 0) {
      nni_mtx_lock((nni_mtx *)events[0x3f].data.ptr);
      nni_posix_pollq_reap((nni_posix_pollq *)events[0x3f].data.ptr);
      if ((*(byte *)(events[0x3f].data.u64 + 0x68) & 1) != 0) {
        nni_mtx_unlock((nni_mtx *)events[0x3f].data.ptr);
        return;
      }
      nni_mtx_unlock((nni_mtx *)events[0x3f].data.ptr);
    }
  }
  return;
}

Assistant:

static void
nni_epoll_thr(void *arg)
{
	nni_posix_pollq   *pq = arg;
	struct epoll_event events[NNI_MAX_EPOLL_EVENTS];

	for (;;) {
		int  n;
		bool reap = false;

		n = epoll_wait(pq->epfd, events, NNI_MAX_EPOLL_EVENTS, -1);
		if ((n < 0) && (errno == EBADF)) {
			// Epoll fd closed, bail.
			return;
		}

		// dispatch events
		for (int i = 0; i < n; ++i) {
			const struct epoll_event *ev;

			ev = &events[i];
			// If the waker pipe was signaled, read from it.
			if ((ev->data.ptr == NULL) &&
			    (ev->events & (unsigned) POLLIN)) {
				uint64_t clear;
				(void) read(pq->evfd, &clear, sizeof(clear));
				reap = true;
			} else {
				nni_posix_pfd *pfd = ev->data.ptr;
				unsigned       mask;

				mask = ev->events &
				    ((unsigned) (EPOLLIN | EPOLLOUT |
				        EPOLLERR | EPOLLHUP));

				nni_atomic_and(&pfd->events, (int) ~mask);

				// Execute the callback with lock released
				pfd->cb(pfd->arg, mask);
			}
		}

		if (reap) {
			nni_mtx_lock(&pq->mtx);
			nni_posix_pollq_reap(pq);
			if (pq->close) {
				nni_mtx_unlock(&pq->mtx);
				return;
			}
			nni_mtx_unlock(&pq->mtx);
		}
	}
}